

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

client_pipe __thiscall pstore::brokerface::fifo_path::open_impl(fifo_path *this)

{
  int iVar1;
  value_type vVar2;
  string *psVar3;
  char *__file;
  int *piVar4;
  ostream *poVar5;
  fifo_path *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  errno_erc local_1b0 [4];
  ostringstream local_1a0 [8];
  ostringstream str;
  int err;
  string *path;
  fifo_path *this_local;
  client_pipe *fdwrite;
  
  psVar3 = get_abi_cxx11_(in_RSI);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0x801);
  details::descriptor<pstore::details::posix_descriptor_traits>::descriptor
            ((descriptor<pstore::details::posix_descriptor_traits> *)this,iVar1);
  vVar2 = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                    ((descriptor<pstore::details::posix_descriptor_traits> *)this);
  if (vVar2 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if ((iVar1 != 2) && (iVar1 != 6)) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar5 = std::operator<<((ostream *)local_1a0,"Could not open FIFO (");
      poVar5 = std::operator<<(poVar5,(string *)psVar3);
      std::operator<<(poVar5,")");
      errno_erc::errno_erc(local_1b0,iVar1);
      std::__cxx11::ostringstream::str();
      raise<pstore::errno_erc,std::__cxx11::string>(local_1b0[0],local_1d0);
    }
  }
  return (client_pipe)this;
}

Assistant:

auto fifo_path::open_impl () const -> client_pipe {
            auto const & path = get ();

            // select() will return on EOF and for every EOF we handle there will be a new EOF which
            // results in read() calls spinning frantically. To avoid this we open the FIFO for both
            // reading and writing (O_RDWR). This ensures there is at least one writer on the FIFO
            // thus there won't be an EOF and as a result select() won't return unless someone
            // writes to the FIFO.

            client_pipe fdwrite{::open (path.c_str (), O_WRONLY | O_NONBLOCK)}; // NOLINT
            if (fdwrite.native_handle () < 0) {
                int const err = errno;

                // If O_NONBLOCK is specified an open for write-only returns –1 with errno set to
                // ENXIO if no process has the FIFO open for reading. In this event, or if the FIFO
                // wasn't found, return an invalid file descriptor. The caller may want to retry
                // once the service is ready to receive connections.
                if (err != ENOENT && err != ENXIO) {
                    std::ostringstream str;
                    str << "Could not open FIFO (" << path << ")";
                    raise (::pstore::errno_erc{err}, str.str ());
                }
            }
            return fdwrite;
        }